

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

int QFileSystemEngine::mkdir(char *__path,__mode_t __mode)

{
  mode_t __mode_00;
  int iVar1;
  void *pvVar2;
  int *piVar3;
  uint in_register_00000034;
  char *pcVar4;
  char *b;
  long in_FS_OFFSET;
  NativePath local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_38,(QFileSystemEntry *)__path);
  pcVar4 = local_38.d.ptr;
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    pvVar2 = memchr(local_38.d.ptr,0,local_38.d.size);
    if ((long)pvVar2 - (long)pcVar4 == -1 || pvVar2 == (void *)0x0) {
      __mode_00 = 0x1ff;
      if ((in_register_00000034 & 1) != 0) {
        __mode_00 = QtPrivate::toMode_t((Permissions)__mode);
      }
      removeTrailingSlashes(&local_38);
      pcVar4 = local_38.d.ptr;
      if (local_38.d.ptr == (char *)0x0) {
        pcVar4 = "";
      }
      iVar1 = ::mkdir(pcVar4,__mode_00);
      iVar1 = (int)CONCAT71((int7)((ulong)&local_38 >> 8),iVar1 == 0);
      goto LAB_0017284a;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  iVar1 = 0;
LAB_0017284a:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkdir(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    auto result = QT_MKDIR(removeTrailingSlashes(path), mode) == 0;
#if defined(Q_OS_VXWORKS)
    if (result)
        forceRequestedPermissionsOnVxWorks(path, mode);
#endif
    return result;
}